

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_md5.h
# Opt level: O2

string * __thiscall
psql::bytes_to_hex_abi_cxx11_(string *__return_storage_ptr__,psql *this,uint8_t *b)

{
  int q;
  long lVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
bytes_to_hex(std::uint8_t b[16])
{
	std::string s;
	static const char *hex = "0123456789abcdef";
	for (int q = 0; q < 16; q++)
	{
		s.push_back(char(hex[(b[q] >> 4) & 0x0F]));
		s.push_back(char(hex[b[q] & 0x0F]));
	}
	return s;
}